

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall Memory::Recycler::DumpObjectGraph(Recycler *this,Param *param)

{
  ObservableValue<Memory::CollectionState> *this_00;
  CollectionState CVar1;
  CollectionState CVar2;
  byte bVar3;
  undefined1 local_7c0 [8];
  AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark;
  RecyclerObjectGraphDumper objectGraphDumper;
  AutoRestoreValue<bool> skipStackToggle;
  DebugCheckNoException __debugCheckNoException;
  
  this_00 = &this->collectionState;
  CVar1 = (this->collectionState).value;
  CVar2 = CVar1;
  if (CVar1 == CollectionStateExit) {
    ObservableValue<Memory::CollectionState>::SetValue(this_00,CollectionStateNotCollecting);
    CVar2 = this_00->value;
  }
  if (CVar2 == CollectionStateNotCollecting) {
    skipStackToggle._20_1_ = 1;
    skipStackToggle._16_4_ = ExceptionCheck::Save();
    RecyclerObjectGraphDumper::RecyclerObjectGraphDumper
              ((RecyclerObjectGraphDumper *)
               (AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks
               + 10),this,param);
    Recycler::AutoSetupRecyclerForNonCollectingMark::AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)local_7c0,this,false);
    skipStackToggle._0_8_ = &this->skipStack;
    skipStackToggle.variable._0_1_ = this->skipStack;
    objectGraphDumper.dumpObjectIsArray = true;
    if ((bool)(char)skipStackToggle.variable == false) {
      if (param == (Param *)0x0) {
        objectGraphDumper.dumpObjectIsArray = false;
      }
      else {
        objectGraphDumper.dumpObjectIsArray = param->skipStack;
      }
    }
    this->skipStack = objectGraphDumper.dumpObjectIsArray;
    Mark(this);
    this->objectGraphDumper = (RecyclerObjectGraphDumper *)0x0;
    if (param != (Param *)0x0) {
      memcpy(&param->stats,&this->collectionStats,0x538);
    }
    AutoRestoreValue<bool>::~AutoRestoreValue
              ((AutoRestoreValue<bool> *)&objectGraphDumper.dumpObjectIsArray);
    Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)local_7c0);
    RecyclerObjectGraphDumper::~RecyclerObjectGraphDumper
              ((RecyclerObjectGraphDumper *)
               (AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks
               + 10));
    skipStackToggle._20_1_ = 0;
    DebugCheckNoException::~DebugCheckNoException
              ((DebugCheckNoException *)&skipStackToggle.oldValue);
    if (CVar1 == CollectionStateExit) {
      ObservableValue<Memory::CollectionState>::SetValue(this_00,CollectionStateExit);
    }
    if (objectGraphDumper.dumpObjectTypeInfo._1_1_ != 0) {
      Output::Print(L"Out of memory dumping object graph\n");
    }
    bVar3 = objectGraphDumper.dumpObjectTypeInfo._1_1_ ^ 1;
  }
  else {
    bVar3 = 0;
    Output::Print(L"Can\'t dump object graph when collecting\n");
  }
  Output::Flush();
  return (bool)bVar3;
}

Assistant:

bool Recycler::DumpObjectGraph(RecyclerObjectGraphDumper::Param * param)
{
    bool succeeded = false;
    bool isExited = (this->collectionState == CollectionStateExit);
    if (isExited)
    {
        this->SetCollectionState(CollectionStateNotCollecting);
    }
    if (this->collectionState != CollectionStateNotCollecting)
    {
        Output::Print(_u("Can't dump object graph when collecting\n"));
        Output::Flush();
        return succeeded;
    }
    BEGIN_NO_EXCEPTION
    {
        RecyclerObjectGraphDumper objectGraphDumper(this, param);

        Recycler::AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark(*this);
        AutoRestoreValue<bool> skipStackToggle(&this->skipStack, this->skipStack || (param && param->skipStack));

        this->Mark();

        this->objectGraphDumper = nullptr;
#ifdef RECYCLER_STATS
        if (param)
        {
            param->stats = this->collectionStats;
        }
#endif
        succeeded = !objectGraphDumper.isOutOfMemory;
    }